

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

ostream * fasttext::utils::operator<<(ostream *out,ClockPrint *me)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar1 = me->duration_;
  iVar2 = iVar1 % 0xe10;
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,iVar1 / 0xe10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"h",1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2 / 0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m",1);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,iVar2 % 0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockPrint& me) {
  int32_t etah = me.duration_ / 3600;
  int32_t etam = (me.duration_ % 3600) / 60;
  int32_t etas = (me.duration_ % 3600) % 60;

  out << std::setw(3) << etah << "h" << std::setw(2) << etam << "m";
  out << std::setw(2) << etas << "s";
  return out;
}